

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForMessage
          (Generator *this,Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  Descriptor *descriptor_00;
  OneofDescriptor *oneof;
  EnumDescriptor *enum_descriptor;
  FieldDescriptor *field_00;
  MessageOptions *this_00;
  undefined1 local_d8 [8];
  string descriptor_name;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  string message_options;
  FieldDescriptor *field_1;
  int i_4;
  FieldDescriptor *field;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  for (i_2 = 0; iVar2 = Descriptor::nested_type_count(descriptor), i_2 < iVar2; i_2 = i_2 + 1) {
    descriptor_00 = Descriptor::nested_type(descriptor,i_2);
    FixOptionsForMessage(this,descriptor_00);
  }
  for (i_3 = 0; iVar2 = Descriptor::oneof_decl_count(descriptor), i_3 < iVar2; i_3 = i_3 + 1) {
    oneof = Descriptor::oneof_decl(descriptor,i_3);
    FixOptionsForOneof(this,oneof);
  }
  for (field._4_4_ = 0; iVar2 = Descriptor::enum_type_count(descriptor), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    enum_descriptor = Descriptor::enum_type(descriptor,field._4_4_);
    FixOptionsForEnum(this,enum_descriptor);
  }
  for (field._0_4_ = 0; iVar2 = Descriptor::field_count(descriptor), (int)field < iVar2;
      field._0_4_ = (int)field + 1) {
    field_00 = Descriptor::field(descriptor,(int)field);
    FixOptionsForField(this,field_00);
  }
  for (field_1._4_4_ = 0; iVar2 = Descriptor::extension_count(descriptor), field_1._4_4_ < iVar2;
      field_1._4_4_ = field_1._4_4_ + 1) {
    message_options.field_2._8_8_ = Descriptor::extension(descriptor,field_1._4_4_);
    FixOptionsForField(this,(FieldDescriptor *)message_options.field_2._8_8_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"MessageOptions",&local_81)
  ;
  this_00 = Descriptor::options(descriptor);
  MessageLite::SerializeAsString_abi_cxx11_
            ((string *)((long)&descriptor_name.field_2 + 8),(MessageLite *)this_00);
  OptionsValue((string *)local_60,this,&local_80,(string *)((long)&descriptor_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(descriptor_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"None");
  if (bVar1) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)local_d8,this,descriptor);
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              ((string *)local_d8,(string *)local_60,this->printer_);
    std::__cxx11::string::~string((string *)local_d8);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void Generator::FixOptionsForMessage(const Descriptor& descriptor) const {
  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixOptionsForMessage(*descriptor.nested_type(i));
  }
  // Oneofs.
  for (int i = 0; i < descriptor.oneof_decl_count(); ++i) {
    FixOptionsForOneof(*descriptor.oneof_decl(i));
  }
  // Enums.
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    FixOptionsForEnum(*descriptor.enum_type(i));
  }
  // Fields.
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    FixOptionsForField(field);
  }
  // Extensions.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    const FieldDescriptor& field = *descriptor.extension(i);
    FixOptionsForField(field);
  }
  // Message option for this message.
  string message_options = OptionsValue(
      "MessageOptions", descriptor.options().SerializeAsString());
  if (message_options != "None") {
    string descriptor_name = ModuleLevelDescriptorName(descriptor);
    PrintDescriptorOptionsFixingCode(descriptor_name,
                                     message_options,
                                     printer_);
  }
}